

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O3

void worker_config_init(worker_config_conflict *wc,int use_broadcast,signal_func signal_f,
                       wait_func wait_f)

{
  int iVar1;
  worker_config_conflict *pwVar2;
  
  memset(wc,0,0xa8);
  wc->signal_cond = signal_f;
  wc->wait_cond = wait_f;
  wc->use_broadcast = use_broadcast;
  pwVar2 = wc;
  iVar1 = uv_sem_init(wc,0);
  if (iVar1 == 0) {
    pwVar2 = (worker_config_conflict *)&wc->sem_signaled;
    iVar1 = uv_sem_init(pwVar2,0);
    if (iVar1 != 0) goto LAB_0014d114;
    pwVar2 = (worker_config_conflict *)&wc->cond;
    iVar1 = uv_cond_init(pwVar2);
    if (iVar1 == 0) {
      pwVar2 = (worker_config_conflict *)&wc->mutex;
      iVar1 = uv_mutex_init(pwVar2);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_0014d11e;
    }
  }
  else {
    worker_config_init_cold_1();
LAB_0014d114:
    worker_config_init_cold_2();
  }
  worker_config_init_cold_3();
LAB_0014d11e:
  worker_config_init_cold_4();
  uv_mutex_destroy(&pwVar2->mutex);
  uv_cond_destroy(&pwVar2->cond);
  uv_sem_destroy(&pwVar2->sem_signaled);
  uv_sem_destroy(pwVar2);
  return;
}

Assistant:

void worker_config_init(worker_config* wc,
                        int use_broadcast,
                        signal_func signal_f,
                        wait_func wait_f) {
  /* Wipe. */
  memset(wc, 0, sizeof(*wc));

  /* Copy vars. */
  wc->signal_cond = signal_f;
  wc->wait_cond = wait_f;
  wc->use_broadcast = use_broadcast;

  /* Init. */
  ASSERT(0 == uv_sem_init(&wc->sem_waiting, 0));
  ASSERT(0 == uv_sem_init(&wc->sem_signaled, 0));
  ASSERT(0 == uv_cond_init(&wc->cond));
  ASSERT(0 == uv_mutex_init(&wc->mutex));
}